

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O0

int kvtree_exchange_direction_hops
              (kvtree *hash_in,kvtree *hash_out,MPI_Comm comm,kvtree_exchange_enum direction,
              int hops)

{
  int val;
  kvtree *pkVar1;
  kvtree *pkVar2;
  bool local_e2;
  kvtree *elem_hash;
  kvtree *dest_hash;
  kvtree *dest_keep;
  kvtree *dest_send;
  kvtree *dest_hash_3;
  int dist;
  kvtree *elem_hash_1;
  int dest_rank_1;
  kvtree *dest_hash_2;
  kvtree *recv;
  kvtree *send;
  kvtree *keep;
  int local_78;
  int src;
  int dst;
  int right;
  int left;
  int hop_count;
  int step;
  int bit;
  kvtree *src_hash;
  kvtree *dest_hash_1;
  kvtree *data_hash;
  kvtree *pkStack_40;
  int dest_rank;
  kvtree *current;
  int ranks;
  int rank;
  kvtree_elem *elem;
  int hops_local;
  kvtree_exchange_enum direction_local;
  MPI_Comm comm_local;
  kvtree *hash_out_local;
  kvtree *hash_in_local;
  
  elem._0_4_ = hops;
  elem._4_4_ = direction;
  _hops_local = comm;
  comm_local = (MPI_Comm)hash_out;
  hash_out_local = hash_in;
  MPI_Comm_rank(comm,(long)&current + 4);
  MPI_Comm_size(_hops_local,&current);
  pkStack_40 = kvtree_new();
  for (_ranks = kvtree_elem_first(hash_out_local); _ranks != (kvtree_elem *)0x0;
      _ranks = kvtree_elem_next(_ranks)) {
    data_hash._4_4_ = kvtree_elem_key_int(_ranks);
    dest_hash_1 = kvtree_elem_hash(_ranks);
    src_hash = kvtree_set_kv_int(pkStack_40,"D",data_hash._4_4_);
    _step = kvtree_set_kv_int(src_hash,"S",current._4_4_);
    kvtree_merge(_step,dest_hash_1);
  }
  hop_count = 1;
  left = 1;
  right = 0;
  while( true ) {
    local_e2 = false;
    if (left < (int)current) {
      local_e2 = (int)elem < 0 || right < (int)elem;
    }
    if (!local_e2) break;
    dst = current._4_4_ - left;
    if (dst < 0) {
      dst = (int)current + dst;
    }
    src = current._4_4_ + left;
    if ((int)current <= src) {
      src = src - (int)current;
    }
    if (elem._4_4_ == KVTREE_EXCHANGE_RIGHT) {
      local_78 = src;
      keep._4_4_ = dst;
    }
    else {
      local_78 = dst;
      keep._4_4_ = src;
    }
    send = kvtree_new();
    recv = kvtree_new();
    dest_hash_2 = kvtree_new();
    pkVar2 = kvtree_get(pkStack_40,"D");
    for (_ranks = kvtree_elem_first(pkVar2); _ranks != (kvtree_elem *)0x0;
        _ranks = kvtree_elem_next(_ranks)) {
      val = kvtree_elem_key_int(_ranks);
      pkVar2 = kvtree_elem_hash(_ranks);
      if (elem._4_4_ == KVTREE_EXCHANGE_RIGHT) {
        dest_hash_3._4_4_ = val - current._4_4_;
      }
      else {
        dest_hash_3._4_4_ = current._4_4_ - val;
      }
      if ((int)dest_hash_3._4_4_ < 0) {
        dest_hash_3._4_4_ = (int)current + dest_hash_3._4_4_;
      }
      if (val == current._4_4_) {
        pkVar2 = kvtree_get(pkVar2,"S");
        kvtree_merge((kvtree *)comm_local,pkVar2);
      }
      else if ((dest_hash_3._4_4_ & hop_count) == 0) {
        pkVar1 = kvtree_set_kv_int(send,"D",val);
        kvtree_merge(pkVar1,pkVar2);
      }
      else {
        pkVar1 = kvtree_set_kv_int(recv,"D",val);
        kvtree_merge(pkVar1,pkVar2);
      }
    }
    kvtree_sendrecv(recv,local_78,dest_hash_2,keep._4_4_,_hops_local);
    kvtree_merge(send,dest_hash_2);
    kvtree_delete(&stack0xffffffffffffffc0);
    pkStack_40 = send;
    kvtree_delete(&dest_hash_2);
    kvtree_delete(&recv);
    hop_count = hop_count << 1;
    left = left << 1;
    right = right + 1;
  }
  pkVar2 = kvtree_get_kv_int(pkStack_40,"D",current._4_4_);
  pkVar2 = kvtree_get(pkVar2,"S");
  kvtree_merge((kvtree *)comm_local,pkVar2);
  kvtree_delete(&stack0xffffffffffffffc0);
  return 0;
}

Assistant:

static int kvtree_exchange_direction_hops(
  const kvtree* hash_in,
        kvtree* hash_out,
  MPI_Comm comm,
  kvtree_exchange_enum direction,
  int hops)
{
  kvtree_elem* elem;

  /* get the size of our communicator and our position within it */
  int rank, ranks;
  MPI_Comm_rank(comm, &rank);
  MPI_Comm_size(comm, &ranks);

  /* set up current hash using input hash */
  kvtree* current = kvtree_new();
  for (elem = kvtree_elem_first(hash_in);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get destination rank */
    int dest_rank = kvtree_elem_key_int(elem);

    /* copy data into current hash with DEST and SRC keys */
    kvtree* data_hash = kvtree_elem_hash(elem);
    kvtree* dest_hash = kvtree_set_kv_int(current,   "D", dest_rank);
    kvtree* src_hash  = kvtree_set_kv_int(dest_hash, "S", rank);
    kvtree_merge(src_hash, data_hash);
  }

  /* now run through Bruck's index algorithm to exchange data,
   * if hops is positive we can stop after that many steps */
  int bit = 1;
  int step = 1;
  int hop_count = 0;
  while (step < ranks && (hops < 0 || hop_count < hops)) {
    /* compute left and right ranks for this step */
    int left = rank - step;
    if (left < 0) {
      left += ranks;
    }
    int right = rank + step;
    if (right >= ranks) {
      right -= ranks;
    }

    /* determine source and destination ranks for this step */
    int dst, src;
    if (direction == KVTREE_EXCHANGE_RIGHT) {
      /* send to the right */
      dst = right;
      src = left;
    } else {
      /* send to the left */
      dst = left;
      src = right;
    }

    /* create hashes for those we'll keep, send, and receive */
    kvtree* keep = kvtree_new();
    kvtree* send = kvtree_new();
    kvtree* recv = kvtree_new();

    /* identify hashes we'll send and keep in this step */
    kvtree* dest_hash = kvtree_get(current, "D");
    for (elem = kvtree_elem_first(dest_hash);
         elem != NULL;
         elem = kvtree_elem_next(elem))
    {
      /* get destination rank and pointer to its hash */
      int dest_rank = kvtree_elem_key_int(elem);
      kvtree* elem_hash = kvtree_elem_hash(elem);

      /* compute relative distance from our rank */
      int dist;
      if (direction == KVTREE_EXCHANGE_RIGHT) {
        dist = dest_rank - rank;
      } else {
        dist = rank - dest_rank;
      }
      if (dist < 0) {
        dist += ranks;
      }

      /* copy item to send, keep, or output hash */
      if (dest_rank == rank) {
        /* we are the destination for this item, discard SRC key
         * and copy hash to output hash */
        kvtree* dest_hash = kvtree_get(elem_hash, "S");
        kvtree_merge(hash_out, dest_hash);
      } else if (dist & bit) {
        /* we send the hash if the bit is set */
        kvtree* dest_send = kvtree_set_kv_int(send, "D", dest_rank);
        kvtree_merge(dest_send, elem_hash);
      } else {
        /* otherwise, copy hash to keep */
        kvtree* dest_keep = kvtree_set_kv_int(keep, "D", dest_rank);
        kvtree_merge(dest_keep, elem_hash);
      }
    }

    /* exchange hashes with our partners */
    kvtree_sendrecv(send, dst, recv, src, comm);

    /* merge received hash into keep */
    kvtree_merge(keep, recv);

    /* delete current hash and point it to keep instead */
    kvtree_delete(&current);
    current = keep;

    /* prepare for next rount */
    kvtree_delete(&recv);
    kvtree_delete(&send);
    bit <<= 1;
    step *= 2;
    hop_count++;
  }

  /* TODO: check that all items are really destined for this rank */

  /* copy current into output hash */
  kvtree* dest_hash = kvtree_get_kv_int(current, "D", rank);
  kvtree* elem_hash = kvtree_get(dest_hash, "S");
  kvtree_merge(hash_out, elem_hash);

  /* free the current hash */
  kvtree_delete(&current);

  return KVTREE_SUCCESS;
}